

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrGetSceneComponentsMSFT
                   (XrSceneMSFT scene,XrSceneComponentsGetInfoMSFT *getInfo,
                   XrSceneComponentsMSFT *components)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrSceneMSFT_T_*>::getWithInstanceInfo(&g_scenemsft_info,scene);
  XVar1 = (*(pVar2.second)->dispatch_table->GetSceneComponentsMSFT)(scene,getInfo,components);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetSceneComponentsMSFT(
    XrSceneMSFT scene,
    const XrSceneComponentsGetInfoMSFT* getInfo,
    XrSceneComponentsMSFT* components) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_scenemsft_info.getWithInstanceInfo(scene);
        GenValidUsageXrHandleInfo *gen_scenemsft_info = info_with_instance.first;
        (void)gen_scenemsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->GetSceneComponentsMSFT(scene, getInfo, components);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}